

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoNode.cc
# Opt level: O2

void __thiscall VideoNode::~VideoNode(VideoNode *this)

{
  ~VideoNode(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

void VideoNode::paint(float dt, const Timecode& tc, IScope &scope) {
	static unsigned int frame_seq = 0;
	frame_seq++;

	if (polled_pipeline->poll(frame_seq)) {
		engine.reset(new VideoEngine(*resources, polled_pipeline->get()));
		engine->setCanvasResolution(c_mode_res[mode_index].w, c_mode_res[mode_index].h);
	}

	if (engine)
		engine->paint(frame_seq, preview.w, preview.h, tc.row, dt, scope);
}